

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O1

double CETime::TimeVect2Dbl(vector<double,_std::allocator<double>_> *time)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](time,0);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](time,1);
  dVar2 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](time,2);
  dVar3 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](time,3);
  return dVar1 * 10000.0 + dVar2 * 100.0 + dVar3 + *pvVar4;
}

Assistant:

double CETime::TimeVect2Dbl(std::vector<double> time)
{
    return time[0] * 10000 +
           time[1] * 100 +
           time[2] + time[3] ;
}